

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O0

UnknownFieldSet * __thiscall
google::protobuf::UnknownFieldSet::AddGroup(UnknownFieldSet *this,int number)

{
  anon_union_8_5_912831f5_for_data_ __x;
  UnknownField field;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
  *in_stack_ffffffffffffffd0;
  UnknownField local_20 [2];
  
  UnknownField::SetType(local_20,TYPE_GROUP);
  __x.group_ = (UnknownFieldSet *)operator_new(0x18);
  UnknownFieldSet((UnknownFieldSet *)0x472538);
  local_20[0].data_ = __x;
  std::vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>::
  push_back(in_stack_ffffffffffffffd0,(value_type *)__x.group_);
  return (UnknownFieldSet *)local_20[0].data_.varint_;
}

Assistant:

UnknownFieldSet* UnknownFieldSet::AddGroup(int number) {
  UnknownField field;
  field.number_ = number;
  field.SetType(UnknownField::TYPE_GROUP);
  field.data_.group_ = new UnknownFieldSet;
  fields_.push_back(field);
  return field.data_.group_;
}